

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Escape::CGraph::sortById(CGraph *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < this->nVertices; lVar1 = lVar1 + 1) {
    std::__sort<long*,__gnu_cxx::__ops::_Iter_less_iter>
              (this->nbors + this->offsets[lVar1],this->nbors + this->offsets[lVar1 + 1]);
  }
  return;
}

Assistant:

void CGraph::sortById() const {
    for (VertexIdx i = 0; i < nVertices; i++)
        std::sort(nbors + offsets[i], nbors + offsets[i + 1]);
}